

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswFilter.c
# Opt level: O2

void Ssw_ManRollForward(Ssw_Man_t *p,int nFrames)

{
  undefined1 *puVar1;
  uint uVar2;
  void *pvVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  int iVar6;
  uint uVar7;
  Aig_Man_t *p_00;
  int iVar8;
  
  if (0 < nFrames) {
    for (iVar8 = 0; p_00 = p->pAig, iVar8 < p_00->nRegs; iVar8 = iVar8 + 1) {
      pvVar3 = Vec_PtrEntry(p_00->vCos,p_00->nTruePos + iVar8);
      iVar6 = p->pAig->nTruePis + iVar8;
      *(ulong *)((long)pvVar3 + 0x18) =
           *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf |
           (ulong)((p->pPatWords[iVar6 >> 5] >> ((byte)iVar6 & 0x1f) & 1) << 5);
    }
    for (iVar8 = 0; iVar8 != nFrames; iVar8 = iVar8 + 1) {
      puVar1 = &p_00->pConst1->field_0x18;
      *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20;
      for (iVar6 = 0; p_00 = p->pAig, iVar6 < p_00->nTruePis; iVar6 = iVar6 + 1) {
        pvVar3 = Vec_PtrEntry(p_00->vCis,iVar6);
        uVar2 = Aig_ManRandom(0);
        *(ulong *)((long)pvVar3 + 0x18) =
             *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf | (ulong)((uVar2 & 1) << 5);
      }
      for (iVar6 = 0; iVar6 < p_00->nRegs; iVar6 = iVar6 + 1) {
        pAVar4 = Saig_ManLi(p_00,iVar6);
        pAVar5 = Saig_ManLo(p->pAig,iVar6);
        *(ulong *)&pAVar5->field_0x18 =
             *(ulong *)&pAVar5->field_0x18 & 0xffffffffffffffdf |
             (ulong)((uint)*(undefined8 *)&pAVar4->field_0x18 & 0x20);
        p_00 = p->pAig;
      }
      for (iVar6 = 0; iVar6 < p_00->vObjs->nSize; iVar6 = iVar6 + 1) {
        pvVar3 = Vec_PtrEntry(p_00->vObjs,iVar6);
        if ((pvVar3 != (void *)0x0) &&
           (0xfffffffd < ((uint)*(ulong *)((long)pvVar3 + 0x18) & 7) - 7)) {
          *(ulong *)((long)pvVar3 + 0x18) =
               *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf |
               (ulong)((((uint)*(ulong *)((long)pvVar3 + 0x10) ^
                        *(uint *)((*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe) + 0x18) >>
                        5) & ((uint)*(ulong *)((long)pvVar3 + 8) ^
                             *(uint *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x18)
                             >> 5) & 1) << 5);
        }
        p_00 = p->pAig;
      }
      for (iVar6 = 0; iVar6 < p_00->vCos->nSize; iVar6 = iVar6 + 1) {
        pvVar3 = Vec_PtrEntry(p_00->vCos,iVar6);
        *(ulong *)((long)pvVar3 + 0x18) =
             *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf |
             (ulong)(((int)*(ulong *)((long)pvVar3 + 8) << 5 ^
                     *(uint *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x18)) & 0x20);
        p_00 = p->pAig;
      }
    }
    for (iVar8 = 0; iVar8 < p_00->nRegs; iVar8 = iVar8 + 1) {
      pvVar3 = Vec_PtrEntry(p_00->vCos,p_00->nTruePos + iVar8);
      p_00 = p->pAig;
      uVar7 = p_00->nTruePis + iVar8;
      iVar6 = (int)uVar7 >> 5;
      uVar2 = p->pPatWords[iVar6];
      uVar7 = uVar7 & 0x1f;
      if (((uVar2 >> (sbyte)uVar7 ^ *(uint *)((long)pvVar3 + 0x18) >> 5) & 1) != 0) {
        p->pPatWords[iVar6] = uVar2 ^ 1 << uVar7;
      }
    }
    return;
  }
  __assert_fail("nFrames > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswFilter.c"
                ,100,"void Ssw_ManRollForward(Ssw_Man_t *, int)");
}

Assistant:

void Ssw_ManRollForward( Ssw_Man_t * p, int nFrames )
{
    Aig_Obj_t * pObj, * pObjLi;
    int f, i;
    assert( nFrames > 0 );
    // assign register outputs
    Saig_ManForEachLi( p->pAig, pObj, i )
        pObj->fMarkB = Abc_InfoHasBit( p->pPatWords, Saig_ManPiNum(p->pAig) + i );
    // simulate the timeframes
    for ( f = 0; f < nFrames; f++ )
    {
        // set the PI simulation information
        Aig_ManConst1(p->pAig)->fMarkB = 1;
        Saig_ManForEachPi( p->pAig, pObj, i )
            pObj->fMarkB = Aig_ManRandom(0) & 1;
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObj, i )
            pObj->fMarkB = pObjLi->fMarkB;
        // simulate internal nodes
        Aig_ManForEachNode( p->pAig, pObj, i )
            pObj->fMarkB = ( Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj) )
                         & ( Aig_ObjFanin1(pObj)->fMarkB ^ Aig_ObjFaninC1(pObj) );
        // assign the COs
        Aig_ManForEachCo( p->pAig, pObj, i )
            pObj->fMarkB = ( Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj) );
    }
    // record the new pattern
    Saig_ManForEachLi( p->pAig, pObj, i )
        if ( pObj->fMarkB ^ Abc_InfoHasBit(p->pPatWords, Saig_ManPiNum(p->pAig) + i) )
            Abc_InfoXorBit( p->pPatWords, Saig_ManPiNum(p->pAig) + i );
}